

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view input,bool cap_next_letter,
          bool preserve_period)

{
  byte bVar1;
  char *pcVar2;
  char cVar3;
  int i;
  csharp *pcVar4;
  
  pcVar2 = (char *)input._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar4 = (csharp *)0x0;
  do {
    cVar3 = (char)__return_storage_ptr__;
    if (this == pcVar4) {
      if ((this != (csharp *)0x0) && ((pcVar2 + -1)[(long)this] == '#')) {
        std::__cxx11::string::push_back(cVar3);
      }
      if ((((__return_storage_ptr__->_M_string_length != 0) && (this != (csharp *)0x0)) &&
          (0xf5 < (byte)(*(__return_storage_ptr__->_M_dataplus)._M_p - 0x3aU))) && (*pcVar2 == '_'))
      {
        std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
      }
      return __return_storage_ptr__;
    }
    bVar1 = pcVar2[(long)pcVar4];
    if ((char)bVar1 < 'a') {
      if ((char)bVar1 < 'A') {
        if (((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x2e && cap_next_letter)) {
          std::__cxx11::string::push_back(cVar3);
        }
      }
      else if (bVar1 < 0x5b) goto LAB_001fad24;
    }
    else if (bVar1 < 0x7b) {
LAB_001fad24:
      std::__cxx11::string::push_back(cVar3);
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

std::string UnderscoresToCamelCase(absl::string_view input,
                                   bool cap_next_letter, bool preserve_period) {
  std::string result;

  // Note:  I distrust ctype.h due to locales.
  for (int i = 0; i < input.size(); i++) {
    if ('a' <= input[i] && input[i] <= 'z') {
      if (cap_next_letter) {
        result += input[i] + ('A' - 'a');
      } else {
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('A' <= input[i] && input[i] <= 'Z') {
      if (i == 0 && !cap_next_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += input[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('0' <= input[i] && input[i] <= '9') {
      result += input[i];
      cap_next_letter = true;
    } else {
      cap_next_letter = true;
      if (input[i] == '.' && preserve_period) {
        result += '.';
      }
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (input.size() > 0 && input[input.size() - 1] == '#') {
    result += '_';
  }

  // https://github.com/protocolbuffers/protobuf/issues/8101
  // To avoid generating invalid identifiers - if the input string
  // starts with _<digit> (or multiple underscores then digit) then
  // we need to preserve the underscore as an identifier cannot start
  // with a digit.
  // This check is being done after the loop rather than before
  // to handle the case where there are multiple underscores before the
  // first digit. We let them all be consumed so we can see if we would
  // start with a digit.
  // Note: not preserving leading underscores for all otherwise valid identifiers
  // so as to not break anything that relies on the existing behaviour
  if (result.size() > 0 && ('0' <= result[0] && result[0] <= '9')
      && input.size() > 0 && input[0] == '_')
  {
      result.insert(0, 1, '_');
  }
  return result;
}